

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_generated_dispatch.c
# Opt level: O0

PFNGLGETPOINTERVKHRPROC epoxy_glGetPointervKHR_resolver(void)

{
  PFNGLGETPOINTERVKHRPROC p_Var1;
  
  p_Var1 = (PFNGLGETPOINTERVKHRPROC)
           gl_provider_resolver
                     ("glGetPointervKHR",epoxy_glGetPointervKHR_resolver::providers,
                      epoxy_glGetPointervKHR_resolver::entrypoints);
  return p_Var1;
}

Assistant:

static PFNGLGETPOINTERVKHRPROC
epoxy_glGetPointervKHR_resolver(void)
{
    static const enum gl_provider providers[] = {
        GL_extension_GL_KHR_debug,
        Desktop_OpenGL_1_1,
        Desktop_OpenGL_4_3,
        GL_extension_GL_KHR_debug,
        OpenGL_ES_1_0,
        GL_extension_GL_EXT_vertex_array,
        gl_provider_terminator
    };
    static const uint32_t entrypoints[] = {
        22401 /* "glGetPointervKHR" */,
        22370 /* "glGetPointerv" */,
        22370 /* "glGetPointerv" */,
        22370 /* "glGetPointerv" */,
        22370 /* "glGetPointerv" */,
        22384 /* "glGetPointervEXT" */,
    };
    return gl_provider_resolver(entrypoint_strings + 22401 /* "glGetPointervKHR" */,
                                providers, entrypoints);
}